

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O0

void __thiscall imrt::Collimator::generateReference(Collimator *this)

{
  int iVar1;
  pair<int,_int> pVar2;
  mapped_type *pmVar3;
  Collimator *in_RDI;
  int j;
  int s;
  int i;
  int in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar4;
  pair<int,_int> local_3c;
  int local_34;
  pair<int,_int> local_30;
  int local_28;
  int local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  int iVar9;
  
  uVar8 = 0;
  uVar5 = 0xffffffff;
  local_1c = 0xffffffff;
  pVar2 = std::make_pair<int,int>
                    ((int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (int *)0x157d2a);
  iVar6 = pVar2.first;
  iVar7 = pVar2.second;
  local_20 = 0;
  pmVar3 = std::
           map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
           ::operator[]((map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
                         *)CONCAT44(uVar8,iVar7),(key_type_conflict *)CONCAT44(iVar6,uVar5));
  std::pair<int,_int>::operator=(pmVar3,(type)&stack0xffffffffffffffec);
  iVar9 = 1;
  local_24 = 1;
  while( true ) {
    iVar4 = local_24;
    iVar1 = getYdim(in_RDI);
    if (iVar1 <= iVar4) break;
    local_28 = 0;
    while( true ) {
      in_stack_ffffffffffffffa8 = local_28 + local_24;
      iVar1 = getYdim(in_RDI);
      if (iVar1 <= in_stack_ffffffffffffffa8) break;
      local_34 = local_28 + local_24;
      local_30 = std::make_pair<int&,int>
                           ((int *)CONCAT44(iVar4,in_stack_ffffffffffffffa8),(int *)0x157dcb);
      pmVar3 = std::
               map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
               ::operator[]((map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
                             *)CONCAT44(iVar9,iVar7),(key_type_conflict *)CONCAT44(iVar6,uVar5));
      std::pair<int,_int>::operator=(pmVar3,&local_30);
      iVar9 = iVar9 + 1;
      local_28 = local_28 + 1;
    }
    local_24 = local_24 + 1;
  }
  getYdim(in_RDI);
  local_3c = std::make_pair<int,int>
                       ((int *)CONCAT44(iVar4,in_stack_ffffffffffffffa8),(int *)0x157e45);
  pmVar3 = std::
           map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
           ::operator[]((map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
                         *)CONCAT44(iVar9,iVar7),(key_type_conflict *)CONCAT44(iVar6,uVar5));
  std::pair<int,_int>::operator=(pmVar3,&local_3c);
  in_RDI->ref_size = iVar9;
  return;
}

Assistant:

void Collimator::generateReference () {
    int i = 0;
    reference[0] = make_pair(-1,-1);
    i = 1;
    for (int s = 1; s < getYdim(); s++) {
      for (int j = 0; (j+s) < getYdim(); j++) {
        reference[i] = make_pair(j,j+s);
        i++;
      }
    }
    reference[i] = make_pair(0, getYdim()-1);
    ref_size = i;
  }